

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O3

laszip_I32 laszip_request_native_extension(laszip_POINTER pointer,laszip_BOOL request)

{
  undefined4 uVar1;
  
  if (pointer == (laszip_POINTER)0x0) {
    return 1;
  }
  if (*(long *)((long)pointer + 0x228) == 0) {
    if (*(long *)((long)pointer + 0x238) == 0) {
      *(bool *)((long)pointer + 0xa81) = request != 0;
      if (request != 0) {
        *(undefined1 *)((long)pointer + 0xa82) = 0;
      }
      *(undefined1 *)((long)pointer + 0x248) = 0;
      return 0;
    }
    uVar1._0_1_ = 'w';
    uVar1._1_1_ = 'r';
    uVar1._2_1_ = 'i';
    uVar1._3_1_ = 't';
  }
  else {
    uVar1._0_1_ = 'r';
    uVar1._1_1_ = 'e';
    uVar1._2_1_ = 'a';
    uVar1._3_1_ = 'd';
  }
  *(undefined4 *)((long)pointer + 0x248) = uVar1;
  builtin_strncpy((char *)((long)pointer + 0x24c),"er i",4);
  builtin_strncpy((char *)((long)pointer + 0x250),"s al",4);
  builtin_strncpy((char *)((long)pointer + 0x254),"read",4);
  *(undefined8 *)((long)pointer + 599) = 0x6e65706f207964;
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_request_native_extension(
    laszip_POINTER                     pointer
    , const laszip_BOOL                request
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is already open");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    laszip_dll->request_native_extension = request;

    if (request) // only one should be on
    {
      laszip_dll->request_compatibility_mode = FALSE;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_request_native_extension");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}